

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O3

void add_entry(archive *a,char *fname,char *sym)

{
  int iVar1;
  archive_entry *entry;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'#',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_birthtime(entry,2,0x14);
  archive_entry_set_atime(entry,3,0x1e);
  archive_entry_set_ctime(entry,4,0x28);
  archive_entry_set_mtime(entry,5,0x32);
  archive_entry_copy_pathname(entry,fname);
  if (sym != (char *)0x0) {
    archive_entry_set_symlink(entry,sym);
  }
  archive_entry_set_mode(entry,0x816d);
  archive_entry_set_size(entry,0);
  iVar1 = archive_write_header(a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",a);
  archive_entry_free(entry);
  return;
}

Assistant:

static void
add_entry(struct archive *a, const char *fname, const char *sym)
{
	struct archive_entry *ae;

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_birthtime(ae, 2, 20);
	archive_entry_set_atime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, fname);
	if (sym != NULL)
		archive_entry_set_symlink(ae, sym);
	archive_entry_set_mode(ae, S_IFREG | 0555);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
}